

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

bool_t prf_header_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int iVar1;
  int iVar2;
  bfile_t *in_RDX;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict3 *data;
  int pos;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  int iVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar4;
  
  if (*in_RDI == prf_header_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    iVar3 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if (0xb < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
      iVar1 = iVar3 + 8;
      iVar2 = iVar3 + 0xc;
      iVar3 = iVar1;
      if (iVar2 <= (int)(uint)in_RDI[1]) {
        bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
        iVar2 = iVar1 + 4;
        iVar3 = iVar2;
        if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
          bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
          iVar1 = iVar2 + 4;
          iVar3 = iVar1;
          if (iVar2 + 0x24 <= (int)(uint)in_RDI[1]) {
            bf_write(unaff_retaddr,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint)((ulong)in_RDI >> 0x20));
            iVar2 = iVar1 + 0x20;
            iVar3 = iVar2;
            if (iVar1 + 0x22 <= (int)(uint)in_RDI[1]) {
              bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
              iVar1 = iVar2 + 2;
              iVar3 = iVar1;
              if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
                iVar2 = iVar1 + 2;
                iVar3 = iVar2;
                if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                  bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
                  iVar1 = iVar2 + 2;
                  iVar3 = iVar1;
                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                    bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
                    iVar2 = iVar1 + 2;
                    iVar3 = iVar2;
                    if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                      bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
                      iVar1 = iVar2 + 2;
                      iVar3 = iVar1;
                      if (iVar2 + 3 <= (int)(uint)in_RDI[1]) {
                        bf_put_int8(in_RDX,(int8_t)((uint)iVar1 >> 0x18));
                        iVar2 = iVar1 + 1;
                        iVar3 = iVar2;
                        if (iVar1 + 2 <= (int)(uint)in_RDI[1]) {
                          bf_put_int8(in_RDX,(int8_t)((uint)iVar2 >> 0x18));
                          iVar1 = iVar2 + 1;
                          iVar3 = iVar1;
                          if (iVar2 + 5 <= (int)(uint)in_RDI[1]) {
                            bf_put_uint32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                               in_stack_ffffffffffffffcc));
                            iVar2 = iVar1 + 4;
                            iVar3 = iVar2;
                            if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                              bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                in_stack_ffffffffffffffcc));
                              iVar1 = iVar2 + 4;
                              iVar3 = iVar1;
                              if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                  in_stack_ffffffffffffffcc));
                                iVar2 = iVar1 + 4;
                                iVar3 = iVar2;
                                if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                  bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                    in_stack_ffffffffffffffcc));
                                  iVar1 = iVar2 + 4;
                                  iVar3 = iVar1;
                                  if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                    bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                      in_stack_ffffffffffffffcc));
                                    iVar2 = iVar1 + 4;
                                    iVar3 = iVar2;
                                    if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                      bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                        in_stack_ffffffffffffffcc));
                                      iVar1 = iVar2 + 4;
                                      iVar3 = iVar1;
                                      if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                        bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,
                                                                          in_stack_ffffffffffffffcc)
                                                       );
                                        iVar2 = iVar1 + 4;
                                        iVar3 = iVar2;
                                        if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                          bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                          iVar1 = iVar2 + 4;
                                          iVar3 = iVar1;
                                          if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                            bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                            iVar2 = iVar1 + 4;
                                            iVar3 = iVar2;
                                            if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                              bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                              iVar1 = iVar2 + 4;
                                              iVar3 = iVar1;
                                              if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                                bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                iVar2 = iVar1 + 4;
                                                iVar3 = iVar2;
                                                if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                                  bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar1 = iVar2 + 4;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar2 = iVar1 + 4;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar1 = iVar2 + 4;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar2 = iVar1 + 4;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar1 = iVar2 + 4;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0xc <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar2 = iVar1 + 4;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 8 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar1 = iVar2 + 4;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar2 = iVar1 + 4;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0xc <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar1 = iVar2 + 8;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 0x10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_float64_be(bfile_00,(float64_t)
                                                                               CONCAT26(
                                                  in_stack_ffffffffffffffce,
                                                  CONCAT24(in_stack_ffffffffffffffcc,
                                                           in_stack_ffffffffffffffc8)));
                                                  iVar2 = iVar1 + 8;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 10 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar1 = iVar2 + 2;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int32_be(bfile_00,CONCAT22(
                                                  in_stack_ffffffffffffffce,
                                                  in_stack_ffffffffffffffcc));
                                                  iVar1 = iVar2 + 4;
                                                  iVar3 = iVar1;
                                                  if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar2 = iVar1 + 2;
                                                  iVar3 = iVar2;
                                                  if (iVar1 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar3 = iVar2 + 2;
                                                  if (iVar2 + 4 <= (int)(uint)in_RDI[1]) {
                                                    bf_put_int16_be(bfile_00,
                                                  in_stack_ffffffffffffffce);
                                                  iVar3 = iVar3 + 2;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar4 = 1;
  }
  else {
    prf_error(9,"tried header save method on node of type %d.",(ulong)*in_RDI);
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_header_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_header_info.opcode ) {
        prf_error( 9, "tried header save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 8) ) break;
        bf_write( bfile, (uint8_t *) data->id, 8 ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->format_revision_level ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->edit_revision_level ); pos += 4;
        if ( node->length < (pos + 32) ) break;
        bf_write( bfile, (uint8_t *) data->date_and_time, 32 ); pos += 32;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_group ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_lod ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_object ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_face ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->unit_multiplier_divisor ); pos += 2;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->vertex_coordinate_units ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        bf_put_int8( bfile, data->texwhite ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved1[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->projection_type ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[1] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[2] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[3] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[4] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[5] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved2[6] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_dof ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->vertex_storage_type ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->database_origin ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_x ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_database_y ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_x ) ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->delta_y ) ); pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_sound ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_path ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[0] ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3[1] ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_clip ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_text ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_bsp ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_switch ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved4 ); pos += 4;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->southwest_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->northeast_corner_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->origin_longitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_upper_latitude ) );
            pos += 8;
        if ( node->length < (pos + 8) ) break;
        bf_put_float64_be( bfile, prf_dblread( data->lambert_lower_latitude ) );
            pos += 8;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_source ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_light_point ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_road ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_cat ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved5 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved6 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved7 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved8 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->earth_ellipsoid_model ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_adaptive ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->next_curve ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved9 ); pos += 2;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}